

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

Bitset * __thiscall
diligent_spirv_cross::Compiler::combined_decoration_for_member
          (Bitset *__return_storage_ptr__,Compiler *this,SPIRType *type,uint32_t index)

{
  uint32_t uVar1;
  ulong uVar2;
  size_t sVar3;
  TypedID *pTVar4;
  Bitset local_c0;
  SPIRType *local_80;
  SPIRType *child_member_type;
  VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_> *pVStack_70;
  uint32_t i;
  SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,_8UL> *member_childs;
  SPIRType *member_type;
  Decoration *dec;
  VectorView<diligent_spirv_cross::Meta::Decoration> *local_50;
  Vector<Decoration> *members;
  uint32_t local_34;
  Meta *local_30;
  Meta *type_meta;
  SPIRType *pSStack_20;
  uint32_t index_local;
  SPIRType *type_local;
  Compiler *this_local;
  Bitset *flags;
  
  type_meta._3_1_ = 0;
  type_meta._4_4_ = index;
  pSStack_20 = type;
  type_local = (SPIRType *)this;
  this_local = (Compiler *)__return_storage_ptr__;
  Bitset::Bitset(__return_storage_ptr__);
  local_34 = (pSStack_20->super_IVariant).self.id;
  local_30 = ParsedIR::find_meta(&this->ir,(ID)local_34);
  if (local_30 != (Meta *)0x0) {
    local_50 = &(local_30->members).super_VectorView<diligent_spirv_cross::Meta::Decoration>;
    uVar2 = (ulong)type_meta._4_4_;
    sVar3 = VectorView<diligent_spirv_cross::Meta::Decoration>::size(local_50);
    if (uVar2 < sVar3) {
      member_type = (SPIRType *)
                    VectorView<diligent_spirv_cross::Meta::Decoration>::operator[]
                              (local_50,(ulong)type_meta._4_4_);
      Bitset::merge_or(__return_storage_ptr__,&((Decoration *)member_type)->decoration_flags);
      pTVar4 = (TypedID *)
               VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>::
               operator[](&(pSStack_20->member_types).
                           super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                          ,(ulong)type_meta._4_4_);
      uVar1 = TypedID::operator_cast_to_unsigned_int(pTVar4);
      member_childs =
           (SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,_8UL> *)
           get<diligent_spirv_cross::SPIRType>(this,uVar1);
      pVStack_70 = &(((SPIRType *)member_childs)->member_types).
                    super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
      ;
      for (child_member_type._4_4_ = 0; uVar2 = (ulong)child_member_type._4_4_,
          sVar3 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>::size
                            (pVStack_70), uVar2 < sVar3;
          child_member_type._4_4_ = child_member_type._4_4_ + 1) {
        pTVar4 = (TypedID *)
                 VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>::
                 operator[](pVStack_70,(ulong)child_member_type._4_4_);
        uVar1 = TypedID::operator_cast_to_unsigned_int(pTVar4);
        local_80 = get<diligent_spirv_cross::SPIRType>(this,uVar1);
        if ((local_80->pointer & 1U) == 0) {
          combined_decoration_for_member
                    (&local_c0,this,(SPIRType *)member_childs,child_member_type._4_4_);
          Bitset::merge_or(__return_storage_ptr__,&local_c0);
          Bitset::~Bitset(&local_c0);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Bitset Compiler::combined_decoration_for_member(const SPIRType &type, uint32_t index) const
{
	Bitset flags;
	auto *type_meta = ir.find_meta(type.self);

	if (type_meta)
	{
		auto &members = type_meta->members;
		if (index >= members.size())
			return flags;
		auto &dec = members[index];

		flags.merge_or(dec.decoration_flags);

		auto &member_type = get<SPIRType>(type.member_types[index]);

		// If our member type is a struct, traverse all the child members as well recursively.
		auto &member_childs = member_type.member_types;
		for (uint32_t i = 0; i < member_childs.size(); i++)
		{
			auto &child_member_type = get<SPIRType>(member_childs[i]);
			if (!child_member_type.pointer)
				flags.merge_or(combined_decoration_for_member(member_type, i));
		}
	}

	return flags;
}